

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

bool __thiscall
testing::internal::
ElementsAreMatcherImpl<const_phmap::btree_set<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>_>_&>
::MatchAndExplain(ElementsAreMatcherImpl<const_phmap::btree_set<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>_>_&>
                  *this,btree_set<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>_>
                        *container,MatchResultListener *listener)

{
  ostream *poVar1;
  pointer pbVar2;
  bool bVar3;
  reference piVar4;
  MatchResultListener *pMVar5;
  pointer pMVar6;
  size_t count;
  MatcherBase<const_int_&> *pMVar7;
  pointer pMVar8;
  _func_int **pp_Var9;
  long lVar10;
  size_t sVar11;
  const_iterator cVar12;
  btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>
  local_220;
  long local_210;
  size_t local_208;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  explanations;
  btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>
  local_1e8 [2];
  StringMatchResultListener s;
  
  poVar1 = listener->stream_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&explanations,
           ((long)(this->matchers_).
                  super__Vector_base<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->matchers_).
                 super__Vector_base<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>
                 ._M_impl.super__Vector_impl_data._M_start) / 0x18,(allocator_type *)&s);
  cVar12 = phmap::priv::
           btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>_>
           ::begin((btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>_>
                    *)container);
  local_220.node = cVar12.node;
  local_220.position = cVar12.position;
  local_210 = 0;
  lVar10 = 0;
  sVar11 = 0;
  while( true ) {
    local_208 = sVar11;
    cVar12 = phmap::priv::
             btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>_>
             ::end((btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>_>
                    *)container);
    if ((local_220.node == cVar12.node) && (local_220.position == cVar12.position)) {
      bVar3 = false;
      goto LAB_001c3bea;
    }
    pMVar6 = (this->matchers_).
             super__Vector_base<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (sVar11 == ((long)(this->matchers_).
                         super__Vector_base<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar6) / 0x18) {
      bVar3 = false;
      goto LAB_001c3bea;
    }
    if (poVar1 == (ostream *)0x0) {
      pMVar7 = (MatcherBase<const_int_&> *)
               ((long)&(pMVar6->super_MatcherBase<const_int_&>).super_MatcherDescriberInterface.
                       _vptr_MatcherDescriberInterface + local_210);
      piVar4 = phmap::priv::
               btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>
               ::operator*(&local_220);
      bVar3 = MatcherBase<const_int_&>::Matches(pMVar7,piVar4);
    }
    else {
      StringMatchResultListener::StringMatchResultListener(&s);
      pMVar7 = (MatcherBase<const_int_&> *)
               ((long)&(((this->matchers_).
                         super__Vector_base<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->super_MatcherBase<const_int_&>)
                       .super_MatcherDescriberInterface._vptr_MatcherDescriberInterface + local_210)
      ;
      piVar4 = phmap::priv::
               btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>
               ::operator*(&local_220);
      bVar3 = MatcherBase<const_int_&>::MatchAndExplain(pMVar7,piVar4,&s.super_MatchResultListener);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=
                ((string *)
                 ((long)&((explanations.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar10),
                 (string *)local_1e8);
      std::__cxx11::string::~string((string *)local_1e8);
      StringMatchResultListener::~StringMatchResultListener(&s);
    }
    if (!bVar3) break;
    phmap::priv::
    btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>
    ::operator++(&local_220);
    sVar11 = sVar11 + 1;
    lVar10 = lVar10 + 0x20;
    local_210 = local_210 + 0x18;
  }
  bVar3 = true;
LAB_001c3bea:
  count = sVar11;
  while ((cVar12 = phmap::priv::
                   btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>_>
                   ::end((btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>_>
                          *)container), local_220.node != cVar12.node ||
         (local_220.position != cVar12.position))) {
    count = count + 1;
    phmap::priv::
    btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>
    ::operator++(&local_220);
  }
  pMVar6 = (this->matchers_).
           super__Vector_base<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pMVar8 = (this->matchers_).
           super__Vector_base<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (((long)pMVar8 - (long)pMVar6) / 0x18 == count) {
    if (!bVar3) {
      bVar3 = true;
      if (poVar1 != (ostream *)0x0) {
        bVar3 = false;
        pp_Var9 = (_func_int **)0x0;
        while (pbVar2 = explanations.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
              s.super_MatchResultListener._vptr_MatchResultListener = pp_Var9,
              pp_Var9 != (_func_int **)(((long)pMVar8 - (long)pMVar6) / 0x18)) {
          if (explanations.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[(long)pp_Var9]._M_string_length != 0) {
            if (bVar3) {
              MatchResultListener::operator<<(listener,(char (*) [7])",\nand ");
            }
            pMVar5 = MatchResultListener::operator<<(listener,(char (*) [16])"whose element #");
            pMVar5 = MatchResultListener::operator<<(pMVar5,(unsigned_long *)&s);
            pMVar5 = MatchResultListener::operator<<(pMVar5,(char (*) [11])" matches, ");
            MatchResultListener::operator<<(pMVar5,pbVar2 + (long)pp_Var9);
            pMVar6 = (this->matchers_).
                     super__Vector_base<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pMVar8 = (this->matchers_).
                     super__Vector_base<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            bVar3 = true;
          }
          pp_Var9 = (_func_int **)((long)s.super_MatchResultListener._vptr_MatchResultListener + 1);
        }
        bVar3 = true;
      }
      goto LAB_001c3e53;
    }
    if (poVar1 != (ostream *)0x0) {
      cVar12 = phmap::priv::
               btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>_>
               ::begin((btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>_>
                        *)container);
      local_1e8[0].node = cVar12.node;
      local_1e8[0].position = cVar12.position;
      while (bVar3 = sVar11 != 0, sVar11 = sVar11 - 1, bVar3) {
        phmap::priv::
        btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>
        ::operator++(local_1e8);
      }
      pMVar5 = MatchResultListener::operator<<(listener,(char (*) [16])"whose element #");
      pMVar5 = MatchResultListener::operator<<(pMVar5,&local_208);
      pMVar5 = MatchResultListener::operator<<(pMVar5,(char (*) [3])0x412cf6);
      piVar4 = phmap::priv::
               btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>
               ::operator*(local_1e8);
      PrintToString<int>((string *)&s,piVar4);
      pMVar5 = MatchResultListener::operator<<
                         (pMVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&s);
      MatchResultListener::operator<<(pMVar5,(char (*) [3])") ");
      std::__cxx11::string::~string((string *)&s);
      MatcherBase<const_int_&>::DescribeNegationTo
                (&(this->matchers_).
                  super__Vector_base<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[local_208].
                  super_MatcherBase<const_int_&>,listener->stream_);
      PrintIfNotEmpty(explanations.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + local_208,listener->stream_);
    }
  }
  else if (count != 0 && poVar1 != (ostream *)0x0) {
    pMVar5 = MatchResultListener::operator<<(listener,(char (*) [11])"which has ");
    Elements((ElementsAreMatcherImpl<const_phmap::btree_set<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>_>_&>
              *)&s,count);
    MatchResultListener::operator<<(pMVar5,(Message *)&s);
    if (s.super_MatchResultListener._vptr_MatchResultListener != (_func_int **)0x0) {
      (**(code **)(*s.super_MatchResultListener._vptr_MatchResultListener + 8))();
    }
  }
  bVar3 = false;
LAB_001c3e53:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&explanations);
  return bVar3;
}

Assistant:

bool MatchAndExplain(Container container,
                       MatchResultListener* listener) const override {
    // To work with stream-like "containers", we must only walk
    // through the elements in one pass.

    const bool listener_interested = listener->IsInterested();

    // explanations[i] is the explanation of the element at index i.
    ::std::vector<std::string> explanations(count());
    StlContainerReference stl_container = View::ConstReference(container);
    auto it = stl_container.begin();
    size_t exam_pos = 0;
    bool unmatched_found = false;

    // Go through the elements and matchers in pairs, until we reach
    // the end of either the elements or the matchers, or until we find a
    // mismatch.
    for (; it != stl_container.end() && exam_pos != count(); ++it, ++exam_pos) {
      bool match;  // Does the current element match the current matcher?
      if (listener_interested) {
        StringMatchResultListener s;
        match = matchers_[exam_pos].MatchAndExplain(*it, &s);
        explanations[exam_pos] = s.str();
      } else {
        match = matchers_[exam_pos].Matches(*it);
      }

      if (!match) {
        unmatched_found = true;
        // We cannot store the iterator for the unmatched element to be used
        // later, as some users use ElementsAre() with a "container" whose
        // iterator is not copy-constructible or copy-assignable.
        //
        // We cannot store a pointer to the element either, as some container's
        // iterators return a temporary.
        //
        // We cannot store the element itself either, as the element may not be
        // copyable.
        //
        // Therefore, we just remember the index of the unmatched element,
        // and use it later to print the unmatched element.
        break;
      }
    }
    // If unmatched_found is true, exam_pos is the index of the mismatch.

    // Find how many elements the actual container has.  We avoid
    // calling size() s.t. this code works for stream-like "containers"
    // that don't define size().
    size_t actual_count = exam_pos;
    for (; it != stl_container.end(); ++it) {
      ++actual_count;
    }

    if (actual_count != count()) {
      // The element count doesn't match.  If the container is empty,
      // there's no need to explain anything as Google Mock already
      // prints the empty container.  Otherwise we just need to show
      // how many elements there actually are.
      if (listener_interested && (actual_count != 0)) {
        *listener << "which has " << Elements(actual_count);
      }
      return false;
    }

    if (unmatched_found) {
      // The element count matches, but the exam_pos-th element doesn't match.
      if (listener_interested) {
        // Find the unmatched element.
        auto unmatched_it = stl_container.begin();
        // We cannot call std::advance() on the iterator, as some users use
        // ElementsAre() with a "container" whose iterator is incompatible with
        // std::advance() (e.g. it may not have the difference_type member
        // type).
        for (size_t i = 0; i != exam_pos; ++i) {
          ++unmatched_it;
        }

        // If the array is long or the elements' print-out is large, it may be
        // hard for the user to find the mismatched element and its
        // corresponding matcher description. Therefore we print the index, the
        // value of the mismatched element, and the corresponding matcher
        // description to ease debugging.
        *listener << "whose element #" << exam_pos << " ("
                  << PrintToString(*unmatched_it) << ") ";
        matchers_[exam_pos].DescribeNegationTo(listener->stream());
        PrintIfNotEmpty(explanations[exam_pos], listener->stream());
      }
      return false;
    }

    // Every element matches its expectation.  We need to explain why
    // (the obvious ones can be skipped).
    if (listener_interested) {
      bool reason_printed = false;
      for (size_t i = 0; i != count(); ++i) {
        const std::string& s = explanations[i];
        if (!s.empty()) {
          if (reason_printed) {
            *listener << ",\nand ";
          }
          *listener << "whose element #" << i << " matches, " << s;
          reason_printed = true;
        }
      }
    }
    return true;
  }